

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionUtilsBullet.cpp
# Opt level: O1

bool chrono::collision::bt_utils::IntersectSegmentBox
               (cbtVector3 *hdims,cbtVector3 *c,cbtVector3 *a,cbtScalar hlen,cbtScalar tol,
               cbtScalar *tMin,cbtScalar *tMax)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_register_00001204 [12];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  *tMin = -1e+18;
  *tMax = 1e+18;
  fVar1 = a->m_floats[0];
  auVar13._8_4_ = 0x7fffffff;
  auVar13._0_8_ = 0x7fffffff7fffffff;
  auVar13._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar13);
  if (tol <= auVar13._0_4_) {
    auVar17._8_4_ = 0x80000000;
    auVar17._0_8_ = 0x8000000080000000;
    auVar17._12_4_ = 0x80000000;
    auVar13 = vxorps_avx512vl(ZEXT416((uint)hdims->m_floats[0]),auVar17);
    auVar19._0_4_ = (auVar13._0_4_ - c->m_floats[0]) / fVar1;
    auVar19._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar17 = ZEXT416((uint)((hdims->m_floats[0] - c->m_floats[0]) / fVar1));
    auVar13 = vminss_avx(auVar19,auVar17);
    auVar13 = vmaxss_avx(ZEXT416((uint)*tMin),auVar13);
    *tMin = auVar13._0_4_;
    auVar13 = vmaxss_avx(auVar19,auVar17);
    auVar13 = vminss_avx(ZEXT416((uint)*tMax),auVar13);
    *tMax = auVar13._0_4_;
    if (auVar13._0_4_ < *tMin) {
      return false;
    }
  }
  else {
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(ZEXT416((uint)c->m_floats[0]),auVar4);
    if (hdims->m_floats[0] < auVar13._0_4_) {
      return false;
    }
  }
  fVar1 = a->m_floats[1];
  auVar5._8_4_ = 0x7fffffff;
  auVar5._0_8_ = 0x7fffffff7fffffff;
  auVar5._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar5);
  if (tol <= auVar13._0_4_) {
    auVar11._8_4_ = 0x80000000;
    auVar11._0_8_ = 0x8000000080000000;
    auVar11._12_4_ = 0x80000000;
    auVar13 = vxorps_avx512vl(ZEXT416((uint)hdims->m_floats[1]),auVar11);
    auVar20._0_4_ = (auVar13._0_4_ - c->m_floats[1]) / fVar1;
    auVar20._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar17 = ZEXT416((uint)((hdims->m_floats[1] - c->m_floats[1]) / fVar1));
    auVar13 = vminss_avx(auVar20,auVar17);
    auVar13 = vmaxss_avx(ZEXT416((uint)*tMin),auVar13);
    *tMin = auVar13._0_4_;
    auVar13 = vmaxss_avx(auVar20,auVar17);
    auVar13 = vminss_avx(ZEXT416((uint)*tMax),auVar13);
    *tMax = auVar13._0_4_;
    if (auVar13._0_4_ < *tMin) {
      return false;
    }
  }
  else {
    auVar6._8_4_ = 0x7fffffff;
    auVar6._0_8_ = 0x7fffffff7fffffff;
    auVar6._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(ZEXT416((uint)c->m_floats[1]),auVar6);
    if (hdims->m_floats[1] < auVar13._0_4_) {
      return false;
    }
  }
  fVar1 = a->m_floats[2];
  auVar7._8_4_ = 0x7fffffff;
  auVar7._0_8_ = 0x7fffffff7fffffff;
  auVar7._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar7);
  if (tol <= auVar13._0_4_) {
    auVar10._8_4_ = 0x80000000;
    auVar10._0_8_ = 0x8000000080000000;
    auVar10._12_4_ = 0x80000000;
    auVar13 = vxorps_avx512vl(ZEXT416((uint)hdims->m_floats[2]),auVar10);
    auVar18._0_4_ = (auVar13._0_4_ - c->m_floats[2]) / fVar1;
    auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar16._0_4_ = (hdims->m_floats[2] - c->m_floats[2]) / fVar1;
    auVar16._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar13 = vminss_avx(auVar18,auVar16);
    auVar13 = vmaxss_avx(ZEXT416((uint)*tMin),auVar13);
    *tMin = auVar13._0_4_;
    auVar13 = vmaxss_avx(auVar18,auVar16);
    auVar13 = vminss_avx(ZEXT416((uint)*tMax),auVar13);
    *tMax = auVar13._0_4_;
    if (auVar13._0_4_ < *tMin) {
      return false;
    }
  }
  else {
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(ZEXT416((uint)c->m_floats[2]),auVar8);
    if (hdims->m_floats[2] < auVar13._0_4_) {
      return false;
    }
  }
  fVar1 = *tMin;
  auVar9._8_4_ = 0x80000000;
  auVar9._0_8_ = 0x8000000080000000;
  auVar9._12_4_ = 0x80000000;
  auVar12._4_12_ = in_register_00001204;
  auVar12._0_4_ = hlen;
  auVar14 = vxorps_avx512vl(auVar12,auVar9);
  fVar15 = auVar14._0_4_;
  if (((fVar15 <= fVar1) || (fVar15 <= *tMax)) && ((fVar1 <= hlen || (*tMax <= hlen)))) {
    if ((fVar1 < fVar15) || (hlen < fVar1)) {
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar14,1);
      bVar3 = (bool)((byte)uVar2 & 1);
      *tMin = (cbtScalar)((uint)bVar3 * (int)fVar15 + (uint)!bVar3 * (int)hlen);
    }
    if ((fVar15 <= *tMax) &&
       (auVar14._4_12_ = in_register_00001204, auVar14._0_4_ = hlen, *tMax <= hlen)) {
      return true;
    }
    *tMax = auVar14._0_4_;
    return true;
  }
  return false;
}

Assistant:

bool IntersectSegmentBox(const cbtVector3& hdims,  // box half-dimensions
                         const cbtVector3& c,      // segment center point
                         const cbtVector3& a,      // segment direction (unit vector)
                         const cbtScalar hlen,     // segment half-length
                         const cbtScalar tol,      // tolerance for parallelism test
                         cbtScalar& tMin,          // segment parameter of first intersection point
                         cbtScalar& tMax           // segment parameter of second intersection point
) {
    tMin = -BT_LARGE_FLOAT;
    tMax = +BT_LARGE_FLOAT;

    if (std::abs(a.x()) < tol) {
        // Segment parallel to the box x-faces
        if (std::abs(c.x()) > hdims.x())
            return false;
    } else {
        cbtScalar t1 = (-hdims.x() - c.x()) / a.x();
        cbtScalar t2 = (+hdims.x() - c.x()) / a.x();

        tMin = cbtMax(tMin, cbtMin(t1, t2));
        tMax = cbtMin(tMax, cbtMax(t1, t2));

        if (tMin > tMax)
            return false;
    }

    if (std::abs(a.y()) < tol) {
        // Segment parallel to the box y-faces
        if (std::abs(c.y()) > hdims.y())
            return false;
    } else {
        cbtScalar t1 = (-hdims.y() - c.y()) / a.y();
        cbtScalar t2 = (+hdims.y() - c.y()) / a.y();

        tMin = cbtMax(tMin, cbtMin(t1, t2));
        tMax = cbtMin(tMax, cbtMax(t1, t2));

        if (tMin > tMax)
            return false;
    }

    if (std::abs(a.z()) < tol) {
        // Capsule axis parallel to the box z-faces
        if (std::abs(c.z()) > hdims.z())
            return false;
    } else {
        cbtScalar t1 = (-hdims.z() - c.z()) / a.z();
        cbtScalar t2 = (+hdims.z() - c.z()) / a.z();

        tMin = cbtMax(tMin, cbtMin(t1, t2));
        tMax = cbtMin(tMax, cbtMax(t1, t2));

        if (tMin > tMax)
            return false;
    }

    // If both intersection points are outside the segment, no intersection
    if ((tMin < -hlen && tMax < -hlen) || (tMin > +hlen && tMax > +hlen))
        return false;

    // Clamp intersection points to segment length
    ChClampValue(tMin, -hlen, +hlen);
    ChClampValue(tMax, -hlen, +hlen);

    return true;
}